

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  long in_RSI;
  Steiner st;
  string fileName;
  TimeUsage timer;
  string *in_stack_00000358;
  Steiner *in_stack_00000360;
  TimeUsage *in_stack_fffffffffffffd10;
  Steiner *pSVar2;
  int *in_stack_fffffffffffffd18;
  char *pcVar3;
  allocator<char> local_2c1;
  string local_2c0 [4];
  TimeType in_stack_fffffffffffffd44;
  string *in_stack_fffffffffffffd48;
  TimeUsage *in_stack_fffffffffffffd50;
  allocator local_299;
  string local_298 [40];
  Steiner *in_stack_fffffffffffffd90;
  undefined1 local_61 [81];
  long local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  std::ios_base::sync_with_stdio(false);
  std::ios::tie((ostream *)((long)&std::cin + *(long *)(std::cin + -0x18)));
  TimeUsage::TimeUsage(in_stack_fffffffffffffd10);
  bVar1 = handleArgument(in_stack_fffffffffffffd18,(char **)in_stack_fffffffffffffd10);
  if (bVar1) {
    pcVar3 = *(char **)(local_10 + 8);
    pSVar2 = (Steiner *)local_61;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_61 + 1),pcVar3,(allocator *)pSVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_61);
    Steiner::Steiner(pSVar2);
    pcVar3 = *(char **)(local_10 + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,pcVar3,&local_299);
    Steiner::parse((Steiner *)st._48_8_,(string *)st._40_8_);
    std::__cxx11::string::~string(local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_299);
    Steiner::solve(in_stack_fffffffffffffd90);
    if ((gDoplot & 1U) != 0) {
      Steiner::plot(in_stack_00000360,in_stack_00000358);
    }
    if ((gOutfile & 1U) != 0) {
      Steiner::outfile((Steiner *)
                       st._lca_place.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (string *)
                       st._edges_del.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage);
    }
    pSVar2 = (Steiner *)&local_2c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2c0,"Steiner",(allocator *)pSVar2);
    TimeUsage::showUsage
              (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd44);
    std::__cxx11::string::~string(local_2c0);
    std::allocator<char>::~allocator(&local_2c1);
    local_4 = 0;
    Steiner::~Steiner(pSVar2);
    std::__cxx11::string::~string((string *)(local_61 + 1));
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  ios::sync_with_stdio(false);
  cin.tie(0);
  TimeUsage timer;
  if (!handleArgument(argc, argv)) return -1;
  string fileName = argv[1];
  Steiner st;
  st.parse(argv[1]);
  st.solve();
#ifdef VERBOSE
  timer.showUsage("solve", TimeUsage::PARTIAL);
  timer.start(TimeUsage::PARTIAL);
#endif
  if (gDoplot) {
    st.plot(plotName);
#ifdef VERBOSE    
    timer.showUsage("plot", TimeUsage::PARTIAL);
    timer.start(TimeUsage::PARTIAL);
#endif
  }
  if (gOutfile) {
    st.outfile(outfileName);
#ifdef VERBOSE
    timer.showUsage("outfile", TimeUsage::PARTIAL);
    timer.start(TimeUsage::PARTIAL);
#endif
  }
  timer.showUsage("Steiner", TimeUsage::FULL);
  return 0;
}